

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale_data.cpp
# Opt level: O0

void __thiscall
booster::locale::util::locale_data::parse_from_country(locale_data *this,string *locale_name)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *in_RSI;
  long in_RDI;
  uint i;
  string tmp;
  size_t end;
  undefined7 in_stack_ffffffffffffff38;
  _Alloc_hider in_stack_ffffffffffffff3f;
  locale_data *in_stack_ffffffffffffff40;
  string local_90 [32];
  string local_70 [48];
  uint local_40;
  undefined4 local_3c;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  locale_data *in_stack_ffffffffffffffe0;
  
  uVar1 = std::__cxx11::string::find_first_of(in_RSI,0x2ae06b);
  std::__cxx11::string::substr((ulong)local_38,(ulong)in_RSI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_40 = 0; uVar2 = (ulong)local_40, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
        local_40 = local_40 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if ((*pcVar4 < 'a') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), 'z' < *pcVar4)) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        if ((*pcVar4 < 'A') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38), 'Z' < *pcVar4)) {
          local_3c = 1;
          goto LAB_0025b11f;
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        in_stack_ffffffffffffff3f = (_Alloc_hider)(*pcVar4 + -0x20);
        in_stack_ffffffffffffff40 = (locale_data *)std::__cxx11::string::operator[]((ulong)local_38)
        ;
        (in_stack_ffffffffffffff40->language)._M_dataplus = in_stack_ffffffffffffff3f;
      }
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_38);
    uVar2 = std::__cxx11::string::size();
    if (uVar1 < uVar2) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar4 == '.') {
        std::__cxx11::string::substr((ulong)local_70,(ulong)in_RSI);
        parse_from_encoding(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::__cxx11::string::~string(local_70);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        if (*pcVar4 == '@') {
          std::__cxx11::string::substr((ulong)local_90,(ulong)in_RSI);
          parse_from_variant(in_stack_ffffffffffffff40,
                             (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                            );
          std::__cxx11::string::~string(local_90);
        }
      }
      local_3c = 0;
    }
    else {
      local_3c = 1;
    }
  }
  else {
    local_3c = 1;
  }
LAB_0025b11f:
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void locale_data::parse_from_country(std::string const &locale_name) 
    {
        size_t end = locale_name.find_first_of("@.");
        std::string tmp = locale_name.substr(0,end);
        if(tmp.empty())
            return;
        for(unsigned i=0;i<tmp.size();i++) {
            if('a' <= tmp[i] && tmp[i]<='z')
                tmp[i]=tmp[i]-'a'+'A';
            else if(tmp[i] < 'A' && 'Z' < tmp[i])
                return;
        }

        country = tmp;

        if(end >= locale_name.size())
            return;
        else if(locale_name[end] == '.') {
           parse_from_encoding(locale_name.substr(end+1));
        }
        else if(locale_name[end] == '@') {
           parse_from_variant(locale_name.substr(end+1));
        }
    }